

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.H
# Opt level: O1

void __thiscall Fl_Tree::open_toggle(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  if (item->_open != '\0') {
    close(this,(int)item);
    return;
  }
  if (item->_open == '\0') {
    Fl_Tree_Item::open(item,(char *)item,docallback);
    Fl_Widget::redraw((Fl_Widget *)this);
    if (docallback != 0) {
      this->_callback_reason = FL_TREE_REASON_OPENED;
      this->_callback_item = item;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
  }
  return;
}

Assistant:

int is_flag(unsigned short flag) const {
    switch (flag) {
      case     OPEN: return(_open ? 1 : 0);
      case  VISIBLE: return(_visible ? 1 : 0);
      case   ACTIVE: return(_active ? 1 : 0);
      case SELECTED: return(_selected ? 1 : 0);
      default:       return(0);
    }
  }